

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

iterator __thiscall
duckdb_fmt::v6::internal::
arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>::
operator()(arg_formatter_base<duckdb_fmt::v6::buffer_range<char>,_duckdb_fmt::v6::internal::error_handler>
           *this,char_type value)

{
  format_specs *pfVar1;
  undefined8 uVar2;
  char_spec_handler local_40;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  pfVar1 = this->specs_;
  local_40.formatter = this;
  local_40.value = value;
  if (pfVar1 != (format_specs *)0x0) {
    if ((pfVar1->type != '\0') && (pfVar1->type != 'c')) {
      char_spec_handler::on_int(&local_40);
      goto LAB_00757eb3;
    }
    if ((0xf < (byte)pfVar1->field_0x9) || ((pfVar1->field_0x9 & 0xf) == 4)) {
      local_30[0] = local_20;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_30,"invalid format specifier for char","");
      uVar2 = duckdb_fmt::v6::internal::error_handler::on_error(&local_40,(string *)local_30);
      if (local_30[0] != local_20) {
        operator_delete(local_30[0]);
      }
      _Unwind_Resume(uVar2);
    }
  }
  write_char(this,value);
LAB_00757eb3:
  return (iterator)(this->writer_).out_.container;
}

Assistant:

iterator operator()(char_type value) {
    internal::handle_char_specs(
        specs_, char_spec_handler(*this, static_cast<char_type>(value)));
    return out();
  }